

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.c
# Opt level: O2

ubyte getbyte(uint address)

{
  ubyte uVar1;
  uchar *puVar2;
  uint uVar3;
  undefined6 in_register_0000003a;
  
  if (-1 < (short)address) {
    return RAM[address];
  }
  uVar3 = (uint)CONCAT62(in_register_0000003a,address);
  if (address < 0xc000) {
    if (romsel != '\f') {
      return 0xff;
    }
    uVar3 = uVar3 - 0x8000;
    puVar2 = lang_ROM;
  }
  else {
    if (0xfcff < (ushort)(address + 0x100)) {
      if ((uVar3 & 0xff00) != 0xfe00) {
        return 0xff;
      }
      uVar1 = (*rsheila[(char)address])();
      return uVar1;
    }
    uVar3 = uVar3 - 0xc000;
    puVar2 = OS_ROM;
  }
  return puVar2[uVar3];
}

Assistant:

ubyte getbyte(uint address) {

    if (address < 0x8000) return RAM[address];
    // If address is below the 32K mark access the RAM


    if (address < 0xC000) return (romsel == 0xC ? lang_ROM[address - 0x8000] : (ubyte) 0xFF);
    // If address is below the 48K mark access the language ROM
    if ((address > 0xFEFF) || (address < 0xFC00)) return OS_ROM[address - 0xC000];
    // If address is outside the 3 pages of memmapped io,
    // access the OS_ROM
    return ((address & 0xFF00) == 0xFE00) ? rsheila[(char) (address)]() : (ubyte) 0xff;

}